

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

uint64_t aom_highbd_get_u_var(YV12_BUFFER_CONFIG *a,int hstart,int width,int vstart,int height)

{
  uint64_t uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  
  uVar1 = (*aom_var_2d_u16)((uint8_t *)
                            (*(long *)(in_RDI + 0x30) + (long)(in_ECX * *(int *)(in_RDI + 0x24)) +
                            (long)in_ESI),*(int *)(in_RDI + 0x24),in_EDX,in_R8D);
  return uVar1 / (ulong)(long)(in_EDX * in_R8D);
}

Assistant:

uint64_t aom_highbd_get_u_var(const YV12_BUFFER_CONFIG *a, int hstart,
                              int width, int vstart, int height) {
  return aom_var_2d_u16(a->u_buffer + vstart * a->uv_stride + hstart,
                        a->uv_stride, width, height) /
         (width * height);
}